

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_restoration_mode(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RestorationInfo *pRVar6;
  RestorationType RVar7;
  AV1_COMMON *in_RDI;
  int s;
  int p_2;
  int size;
  RestorationInfo *rsi_1;
  int p_1;
  int sb_size;
  RestorationInfo *rsi;
  int p;
  int chroma_none;
  int all_none;
  int num_planes;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_40;
  int local_30;
  int local_20;
  
  iVar3 = av1_num_planes(in_RDI);
  if (((in_RDI->features).allow_intrabc & 1U) == 0) {
    bVar1 = true;
    bVar2 = true;
    for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
      pRVar6 = in_RDI->rst_info + local_20;
      iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (iVar4 == 0) {
        iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        RVar7 = RESTORE_NONE;
        if (iVar4 != 0) {
          RVar7 = RESTORE_SWITCHABLE;
        }
        pRVar6->frame_restoration_type = RVar7;
      }
      else {
        iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        RVar7 = RESTORE_WIENER;
        if (iVar4 != 0) {
          RVar7 = RESTORE_SGRPROJ;
        }
        pRVar6->frame_restoration_type = RVar7;
      }
      if (pRVar6->frame_restoration_type != RESTORE_NONE) {
        bVar1 = false;
        bVar2 = (bool)(local_20 == 0 & bVar2);
      }
    }
    if (bVar1) {
      for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
        in_RDI->rst_info[local_40].restoration_unit_size = 0x100;
      }
    }
    else {
      iVar4 = 0x40;
      if (in_RDI->seq_params->sb_size == BLOCK_128X128) {
        iVar4 = 0x80;
      }
      for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
        in_RDI->rst_info[local_30].restoration_unit_size = iVar4;
      }
      if (iVar4 == 0x40) {
        iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        in_RDI->rst_info[0].restoration_unit_size =
             in_RDI->rst_info[0].restoration_unit_size << ((byte)iVar4 & 0x1f);
      }
      if (0x40 < in_RDI->rst_info[0].restoration_unit_size) {
        iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        in_RDI->rst_info[0].restoration_unit_size =
             in_RDI->rst_info[0].restoration_unit_size << ((byte)iVar4 & 0x1f);
      }
    }
    if (1 < iVar3) {
      if (in_RDI->seq_params->subsampling_x < in_RDI->seq_params->subsampling_y) {
        iVar3 = in_RDI->seq_params->subsampling_x;
      }
      else {
        iVar3 = in_RDI->seq_params->subsampling_y;
      }
      if ((iVar3 == 0) || (bVar2)) {
        in_RDI->rst_info[1].restoration_unit_size = in_RDI->rst_info[0].restoration_unit_size;
      }
      else {
        iVar4 = in_RDI->rst_info[0].restoration_unit_size;
        iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar3));
        in_RDI->rst_info[1].restoration_unit_size = iVar4 >> ((char)iVar5 * (char)iVar3 & 0x1fU);
      }
      in_RDI->rst_info[2].restoration_unit_size = in_RDI->rst_info[1].restoration_unit_size;
    }
  }
  return;
}

Assistant:

static inline void decode_restoration_mode(AV1_COMMON *cm,
                                           struct aom_read_bit_buffer *rb) {
  assert(!cm->features.all_lossless);
  const int num_planes = av1_num_planes(cm);
  if (cm->features.allow_intrabc) return;
  int all_none = 1, chroma_none = 1;
  for (int p = 0; p < num_planes; ++p) {
    RestorationInfo *rsi = &cm->rst_info[p];
    if (aom_rb_read_bit(rb)) {
      rsi->frame_restoration_type =
          aom_rb_read_bit(rb) ? RESTORE_SGRPROJ : RESTORE_WIENER;
    } else {
      rsi->frame_restoration_type =
          aom_rb_read_bit(rb) ? RESTORE_SWITCHABLE : RESTORE_NONE;
    }
    if (rsi->frame_restoration_type != RESTORE_NONE) {
      all_none = 0;
      chroma_none &= p == 0;
    }
  }
  if (!all_none) {
    assert(cm->seq_params->sb_size == BLOCK_64X64 ||
           cm->seq_params->sb_size == BLOCK_128X128);
    const int sb_size = cm->seq_params->sb_size == BLOCK_128X128 ? 128 : 64;

    for (int p = 0; p < num_planes; ++p)
      cm->rst_info[p].restoration_unit_size = sb_size;

    RestorationInfo *rsi = &cm->rst_info[0];

    if (sb_size == 64) {
      rsi->restoration_unit_size <<= aom_rb_read_bit(rb);
    }
    if (rsi->restoration_unit_size > 64) {
      rsi->restoration_unit_size <<= aom_rb_read_bit(rb);
    }
  } else {
    const int size = RESTORATION_UNITSIZE_MAX;
    for (int p = 0; p < num_planes; ++p)
      cm->rst_info[p].restoration_unit_size = size;
  }

  if (num_planes > 1) {
    int s =
        AOMMIN(cm->seq_params->subsampling_x, cm->seq_params->subsampling_y);
    if (s && !chroma_none) {
      cm->rst_info[1].restoration_unit_size =
          cm->rst_info[0].restoration_unit_size >> (aom_rb_read_bit(rb) * s);
    } else {
      cm->rst_info[1].restoration_unit_size =
          cm->rst_info[0].restoration_unit_size;
    }
    cm->rst_info[2].restoration_unit_size =
        cm->rst_info[1].restoration_unit_size;
  }
}